

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O0

void __thiscall Effects_Buffer::end_frame(Effects_Buffer *this,blip_time_t clock_count)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  blip_time_t in_ESI;
  long in_RDI;
  int stereo_mask;
  int i;
  int bufs_used;
  undefined4 local_14;
  undefined4 local_10;
  
  local_10 = 0;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x278); local_14 = local_14 + 1) {
    iVar1 = Blip_Buffer::clear_modified((Blip_Buffer *)(in_RDI + 0x20 + (long)local_14 * 0x40));
    local_10 = iVar1 << ((byte)local_14 & 0x1f) | local_10;
    Blip_Buffer::end_frame((Blip_Buffer *)(in_RDI + 0x20 + (long)local_14 * 0x40),in_ESI);
  }
  uVar2 = 6;
  if ((*(byte *)(in_RDI + 0x260) & 1) != 0) {
    uVar2 = 0x78;
  }
  if (((local_10 & uVar2) != 0) && (*(int *)(in_RDI + 0x278) == 7)) {
    lVar3 = Blip_Buffer::samples_avail((Blip_Buffer *)(in_RDI + 0x20));
    iVar1 = Blip_Buffer::output_latency((Blip_Buffer *)(in_RDI + 0x20));
    *(long *)(in_RDI + 0x268) = lVar3 + iVar1;
  }
  if (((*(byte *)(in_RDI + 0x27c) & 1) != 0) || ((*(byte *)(in_RDI + 0x260) & 1) != 0)) {
    lVar3 = Blip_Buffer::samples_avail((Blip_Buffer *)(in_RDI + 0x20));
    iVar1 = Blip_Buffer::output_latency((Blip_Buffer *)(in_RDI + 0x20));
    *(long *)(in_RDI + 0x270) = lVar3 + iVar1;
  }
  *(byte *)(in_RDI + 0x27c) = *(byte *)(in_RDI + 0x260) & 1;
  return;
}

Assistant:

void Effects_Buffer::end_frame( blip_time_t clock_count )
{
	int bufs_used = 0;
	for ( int i = 0; i < buf_count; i++ )
	{
		bufs_used |= bufs [i].clear_modified() << i;
		bufs [i].end_frame( clock_count );
	}
	
	int stereo_mask = (config_.effects_enabled ? 0x78 : 0x06);
	if ( (bufs_used & stereo_mask) && buf_count == max_buf_count )
		stereo_remain = bufs [0].samples_avail() + bufs [0].output_latency();
	
	if ( effects_enabled || config_.effects_enabled )
		effect_remain = bufs [0].samples_avail() + bufs [0].output_latency();
	
	effects_enabled = config_.effects_enabled;
}